

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::net::Socket_testFailConnectURI_Test::TestBody(Socket_testFailConnectURI_Test *this)

{
  char cVar1;
  socklen_t in_ECX;
  int __fd;
  Socket *pSVar2;
  Socket socket;
  URI uri;
  AssertHelper aAStack_138 [8];
  Socket local_130;
  Socket local_120;
  long local_110 [15];
  sockaddr local_98;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 local_68 [24];
  undefined1 *local_50;
  undefined1 local_40 [16];
  undefined1 *local_30;
  undefined1 local_20 [16];
  
  jaegertracing::net::Socket::OSResource::OSResource(&local_130._osResource);
  local_130._handle = -1;
  local_130._family = -1;
  local_130._type = -1;
  Socket::open(&local_130,(char *)0x2,1);
  local_120._0_8_ = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"http://127.0.0.1:12345","");
  jaegertracing::net::URI::parse((string *)&local_98);
  if ((long *)local_120._0_8_ != local_110) {
    operator_delete((void *)local_120._0_8_);
  }
  cVar1 = testing::internal::AlwaysTrue();
  if (cVar1 != '\0') {
    Socket::connect(&local_120,(int)&local_130,&local_98,in_ECX);
  }
  testing::Message::Message((Message *)&local_120);
  testing::internal::AssertHelper::AssertHelper
            (aAStack_138,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/SocketTest.cpp"
             ,0x38,
             "Expected: socket.connect(uri) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
            );
  pSVar2 = &local_120;
  testing::internal::AssertHelper::operator=(aAStack_138,(Message *)pSVar2);
  __fd = (int)pSVar2;
  testing::internal::AssertHelper::~AssertHelper(aAStack_138);
  if ((long *)local_120._0_8_ != (long *)0x0) {
    cVar1 = testing::internal::IsTrue(true);
    if ((cVar1 != '\0') && ((long *)local_120._0_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_120._0_8_ + 8))();
    }
    local_120._0_8_ = (long *)0x0;
  }
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if ((undefined1 *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_);
  }
  Socket::close(&local_130,__fd);
  jaegertracing::net::Socket::OSResource::~OSResource(&local_130._osResource);
  return;
}

Assistant:

TEST(Socket, testFailConnectURI)
{
    Socket socket;
    socket.open(AF_INET, SOCK_STREAM);
    const auto uri = URI::parse("http://127.0.0.1:12345");
    ASSERT_THROW(socket.connect(uri), std::runtime_error);
}